

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::WriteMessage<proto2_unittest::OneString>
          (internal *this,string_view value,OneString *message,string *wire_buffer)

{
  string_view value_00;
  byte bVar1;
  uint32_t *puVar2;
  Arena *arena;
  MessageLite *this_00;
  string *wire_buffer_local;
  OneString *message_local;
  string_view value_local;
  
  this_00 = (MessageLite *)value._M_str;
  puVar2 = HasBits<1>::operator[]((HasBits<1> *)(this_00 + 1),0);
  *puVar2 = *puVar2 | 1;
  arena = protobuf::MessageLite::GetArena(this_00);
  value_00._M_str = (char *)value._M_len;
  value_00._M_len = (size_t)this;
  ArenaStringPtr::Set((ArenaStringPtr *)&this_00[1]._internal_metadata_,value_00,arena);
  std::__cxx11::string::clear();
  protobuf::MessageLite::AppendToString(this_00,(string *)message);
  bVar1 = std::__cxx11::string::empty();
  return (bool)((bVar1 ^ 0xff) & 1);
}

Assistant:

bool WriteMessage(absl::string_view value, T* message,
                  std::string* wire_buffer) {
  message->set_data(value);
  wire_buffer->clear();
  message->AppendToString(wire_buffer);
  return (!wire_buffer->empty());
}